

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

FILE * find_in_path(char *name,char *path,char **pfullname)

{
  char *pcVar1;
  size_t sVar2;
  char *__dest;
  FILE *pFVar3;
  size_t __n;
  
  if (path != (char *)0x0) {
    do {
      pcVar1 = strchr(path,0x3a);
      if (pcVar1 == (char *)0x0) {
        __n = strlen(path);
        pcVar1 = (char *)0x0;
      }
      else {
        __n = (long)pcVar1 - (long)path;
        pcVar1 = pcVar1 + 1;
      }
      if (__n != 0) {
        sVar2 = strlen(name);
        __dest = (char *)malloc(sVar2 + __n + 2);
        strncpy(__dest,path,__n);
        (__dest + __n)[0] = '/';
        (__dest + __n)[1] = '\0';
        strcat(__dest,name);
        pFVar3 = fopen(__dest,"r");
        if (pFVar3 != (FILE *)0x0) {
          if (pfullname != (char **)0x0) {
            *pfullname = __dest;
            return (FILE *)pFVar3;
          }
          free(__dest);
          return (FILE *)pFVar3;
        }
        free(__dest);
      }
      path = pcVar1;
    } while (pcVar1 != (char *)0x0);
  }
  return (FILE *)0x0;
}

Assistant:

FILE *find_in_path(const char *name, const char *path, char **pfullname) {
	if (!path)
		return 0;
	while (path) {
		const char *npath = strchr(path, ':');
		size_t plen;
		if (npath) {
			plen = npath - path;
			npath++;
		} else {
			plen = strlen(path);
		}
		if (plen) {
			char *fullname = malloc(strlen(name) + plen + 2);
			strncpy(fullname, path, plen);
			fullname[plen] = '/';
			fullname[plen+1] = 0;
			strcat(fullname, name);
			FILE *file = fopen(fullname, "r");
			if (file) {
				if (pfullname)
					*pfullname = fullname;
				else
					free(fullname);
				return file;
			}
			free(fullname);
		}
		path = npath;
	}
	return 0;
}